

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

Result wabt::WriteBinaryModule(Stream *stream,Module *module,WriteBinaryOptions *options)

{
  _Hash_node_base *p_Var1;
  FuncCodeMetadata *pFVar2;
  pointer pRVar3;
  Result RVar4;
  long lVar5;
  size_t extraout_RDX;
  size_t __n;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  __node_ptr __tmp;
  __node_base _Var6;
  FuncCodeMetadata *this;
  pointer pRVar7;
  BinaryWriter binary_writer;
  
  binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  binary_writer.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binary_writer.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binary_writer.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary_writer.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binary_writer.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binary_writer.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary_writer.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binary_writer.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binary_writer.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary_writer.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binary_writer.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binary_writer.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  binary_writer.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binary_writer.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binary_writer.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  binary_writer.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  binary_writer.current_reloc_section_._0_4_ = 0;
  binary_writer._196_8_ = 0;
  binary_writer.last_section_offset_ = 0;
  binary_writer.last_section_leb_size_guess_ = 0;
  binary_writer.last_section_type_ = Invalid;
  binary_writer.code_metadata_sections_._M_h._M_buckets =
       &binary_writer.code_metadata_sections_._M_h._M_single_bucket;
  binary_writer.last_section_payload_offset_ = 0;
  binary_writer.last_subsection_offset_ = 0;
  binary_writer.last_subsection_leb_size_guess_ = 0;
  binary_writer.last_subsection_payload_offset_ = 0;
  binary_writer.code_start_ = 0;
  binary_writer.data_count_start_._0_1_ = 0;
  binary_writer.data_count_start_._1_7_ = 0;
  binary_writer.data_count_end_._0_1_ = 0;
  binary_writer._281_8_ = 0;
  binary_writer.code_metadata_sections_._M_h._M_bucket_count = 1;
  binary_writer.code_metadata_sections_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  binary_writer.code_metadata_sections_._M_h._M_element_count = 0;
  binary_writer.code_metadata_sections_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  binary_writer.code_metadata_sections_._M_h._M_rehash_policy._M_next_resize = 0;
  binary_writer.code_metadata_sections_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  binary_writer.stream_ = stream;
  binary_writer.options_ = options;
  binary_writer.module_ = module;
  binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       binary_writer.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar4 = anon_unknown_1::BinaryWriter::WriteModule(&binary_writer);
  __n = extraout_RDX;
  _Var6 = binary_writer.code_metadata_sections_._M_h._M_before_begin;
  while (_Var6._M_nxt != (_Hash_node_base *)0x0) {
    p_Var1 = (_Var6._M_nxt)->_M_nxt;
    pFVar2 = (FuncCodeMetadata *)_Var6._M_nxt[4]._M_nxt;
    for (this = (FuncCodeMetadata *)_Var6._M_nxt[3]._M_nxt; this != pFVar2; this = this + 1) {
      anon_unknown_1::FuncCodeMetadata::~FuncCodeMetadata(this);
      __n = extraout_RDX_00;
    }
    std::
    _Vector_base<wabt::(anonymous_namespace)::FuncCodeMetadata,_std::allocator<wabt::(anonymous_namespace)::FuncCodeMetadata>_>
    ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::FuncCodeMetadata,_std::allocator<wabt::(anonymous_namespace)::FuncCodeMetadata>_>
                     *)_Var6._M_nxt[3]._M_nxt,
                    (pointer)((long)_Var6._M_nxt[5]._M_nxt - (long)_Var6._M_nxt[3]._M_nxt >> 5),__n)
    ;
    operator_delete(_Var6._M_nxt,0x38);
    __n = extraout_RDX_01;
    _Var6._M_nxt = p_Var1;
  }
  memset(binary_writer.code_metadata_sections_._M_h._M_buckets,0,
         binary_writer.code_metadata_sections_._M_h._M_bucket_count << 3);
  binary_writer.code_metadata_sections_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  binary_writer.code_metadata_sections_._M_h._M_element_count = 0;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_wabt::(anonymous_namespace)::CodeMetadataSection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_wabt::(anonymous_namespace)::CodeMetadataSection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_deallocate_buckets(&binary_writer.code_metadata_sections_._M_h);
  pRVar3 = binary_writer.reloc_sections_.
           super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar7 = binary_writer.reloc_sections_.
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    std::_Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>::~_Vector_base
              (&(pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>)
    ;
  }
  lVar5 = CONCAT44(binary_writer.reloc_sections_.
                   super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   binary_writer.reloc_sections_.
                   super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
          (long)binary_writer.reloc_sections_.
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                   *)binary_writer.reloc_sections_.
                     super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                     ._M_impl.super__Vector_impl_data._M_start,(pointer)(lVar5 / 0x28),lVar5 % 0x28)
  ;
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&binary_writer.symtab_.seen_names_._M_t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&binary_writer.symtab_.globals_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&binary_writer.symtab_.tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&binary_writer.symtab_.functions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                   *)binary_writer.symtab_.symbols_.
                     super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                  (pointer)(((long)binary_writer.symtab_.symbols_.
                                   super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)binary_writer.symtab_.symbols_.
                                  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x38),
                  ((long)binary_writer.symtab_.symbols_.
                         super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)binary_writer.symtab_.symbols_.
                        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                        ._M_impl.super__Vector_impl_data._M_start) % 0x38);
  return (Result)RVar4.enum_;
}

Assistant:

void BinaryWriter::WriteTableNumberWithReloc(Index value, const char* desc) {
  // Unless reference types are enabled, all references to tables refer to table
  // 0, so no relocs need be emitted when making relocatable binaries.
  if (options_.relocatable && options_.features.reference_types_enabled()) {
    AddReloc(RelocType::TableNumberLEB, value);
    WriteFixedS32Leb128(stream_, value, desc);
  } else {
    WriteS32Leb128(stream_, value, desc);
  }
}